

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int cuddBddAlignToZdd(DdManager *table)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *permutation;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = table->size;
  if ((long)iVar6 == 0) {
    iVar3 = 1;
  }
  else {
    iVar1 = table->sizeZ;
    iVar2 = iVar1 / iVar6;
    iVar3 = 0;
    if (iVar2 * iVar6 == iVar1) {
      permutation = (int *)malloc((long)iVar6 << 2);
      if (permutation == (int *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
        iVar3 = 0;
      }
      else {
        for (uVar4 = 0; (long)uVar4 < (long)iVar1; uVar4 = uVar4 + (long)iVar2) {
          permutation
          [(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                (long)iVar2)] = table->invpermZ[uVar4] / iVar2;
        }
        iVar6 = 0;
        cuddGarbageCollect(table,0);
        table->isolated = 0;
        for (lVar5 = 0; lVar5 < table->size; lVar5 = lVar5 + 1) {
          if (table->vars[lVar5]->ref == 1) {
            iVar6 = iVar6 + 1;
            table->isolated = iVar6;
          }
        }
        iVar6 = cuddInitInteract(table);
        if (iVar6 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = ddShuffle(table,permutation);
          free(permutation);
          if (table->interact != (long *)0x0) {
            free(table->interact);
            table->interact = (long *)0x0;
          }
          bddFixTree(table,table->tree);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
cuddBddAlignToZdd(
  DdManager * table /* DD manager */)
{
    int *invperm;               /* permutation array */
    int M;                      /* ratio of ZDD variables to BDD variables */
    int i;                      /* loop index */
    int result;                 /* return value */

    /* We assume that a ratio of 0 is OK. */
    if (table->size == 0)
        return(1);

    M = table->sizeZ / table->size;
    /* Check whether the number of ZDD variables is a multiple of the
    ** number of BDD variables.
    */
    if (M * table->size != table->sizeZ)
        return(0);
    /* Create and initialize the inverse permutation array. */
    invperm = ABC_ALLOC(int,table->size);
    if (invperm == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < table->sizeZ; i += M) {
        int indexZ = table->invpermZ[i];
        int index  = indexZ / M;
        invperm[i / M] = index;
    }
    /* Eliminate dead nodes. Do not scan the cache again, because we
    ** assume that Cudd_zddReduceHeap has already cleared it.
    */
    cuddGarbageCollect(table,0);

    /* Initialize number of isolated projection functions. */
    table->isolated = 0;
    for (i = 0; i < table->size; i++) {
        if (table->vars[i]->ref == 1) table->isolated++;
    }

    /* Initialize the interaction matrix. */
    result = cuddInitInteract(table);
    if (result == 0) return(0);

    result = ddShuffle(table, invperm);
    ABC_FREE(invperm);
    /* Free interaction matrix. */
    ABC_FREE(table->interact);
    /* Fix the BDD variable group tree. */
    bddFixTree(table,table->tree);
    return(result);

}